

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O1

void duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  idx_t count;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  unsigned_short *puVar6;
  allocate_function_ptr_t p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  hugeint_t *ldata;
  byte bVar8;
  bool bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  reference pvVar12;
  VectorBuffer *pVVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  idx_t iVar17;
  hugeint_t hVar18;
  hugeint_t min_val;
  optional_idx dict_size;
  duckdb adds_nulls;
  element_type *in_stack_ffffffffffffff38;
  element_type *peVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  hugeint_t *local_b0;
  hugeint_t local_a8;
  Vector *local_98;
  idx_t local_90;
  hugeint_t *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  local_a8.lower = *(uint64_t *)pvVar12->data;
  local_a8.upper = *(uint64_t *)((long)pvVar12->data + 8);
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = pvVar12->vector_type;
  local_b0 = &local_a8;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    adds_nulls = SUB81(in_stack_ffffffffffffff38,0);
    puVar6 = (unsigned_short *)result->data;
    ldata = (hugeint_t *)pvVar12->data;
    FlatVector::VerifyFlatVector(pvVar12);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::hugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
              (ldata,puVar6,count,&pvVar12->validity,&result->validity,&local_b0,(bool)adds_nulls);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar3 = result->data;
      pdVar4 = pvVar12->data;
      puVar5 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      local_78.sel = *(SelectionVector **)pdVar4;
      local_78.data = *(data_ptr_t *)(pdVar4 + 8);
      hVar18 = hugeint_t::operator-((hugeint_t *)&local_78,&local_a8);
      *(short *)pdVar3 = (short)hVar18.lower;
      return;
    }
    goto LAB_0101ee02;
  }
  DictionaryVector::VerifyDictionary(pvVar12);
  pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar12->buffer);
  local_78.sel = (SelectionVector *)pVVar13[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar17 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar17 * 2)) {
LAB_0101edf8:
    bVar9 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(pvVar12);
    pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar12->auxiliary);
    if (*(char *)&pVVar13[1]._vptr_VectorBuffer != '\0') goto LAB_0101edf8;
    local_98 = (Vector *)(pVVar13 + 1);
    puVar6 = (unsigned_short *)result->data;
    local_88 = (hugeint_t *)pVVar13[1].data.pointer;
    local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector(local_98);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::hugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
              (local_88,puVar6,local_90,(ValidityMask *)&pVVar13[1].data.allocated_size,
               &result->validity,&local_b0,(bool)SUB81(in_stack_ffffffffffffff38,0));
    DictionaryVector::VerifyDictionary(pvVar12);
    pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar12->buffer);
    iVar17 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar17,(SelectionVector *)(pVVar13 + 1),count);
    bVar9 = true;
  }
  if (bVar9) {
    return;
  }
LAB_0101ee02:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(pvVar12,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar11 = local_78.sel;
  pdVar3 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar17 = 0;
      do {
        hVar18 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
        *(short *)(pdVar3 + iVar17 * 2) = (short)hVar18.lower;
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
    }
  }
  else if (count != 0) {
    p_Var7 = (allocate_function_ptr_t)pSVar11->sel_vector;
    uVar16 = 0;
    do {
      p_Var10 = p_Stack_c0;
      uVar14 = uVar16;
      if (p_Var7 != (allocate_function_ptr_t)0x0) {
        uVar14 = (ulong)*(uint *)(p_Var7 + uVar16 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
           >> (uVar14 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&stack0xffffffffffffff38,&local_80);
          peVar19 = (element_type *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = in_stack_ffffffffffffff38;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          in_stack_ffffffffffffff38 = peVar19;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            in_stack_ffffffffffffff38 = peVar19;
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar16 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar16 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      else {
        in_stack_ffffffffffffff38 = *(element_type **)(local_78.data + uVar14 * 0x10);
        p_Stack_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      (local_78.data + uVar14 * 0x10 + 8);
        hVar18 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
        *(short *)(pdVar3 + uVar16 * 2) = (short)hVar18.lower;
      }
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}